

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

Vec_Int_t * Cbs2_ManSolveMiterNc(Gia_Man_t *pAig,int nConfs,Vec_Str_t **pvStatus,int fVerbose)

{
  Vec_Int_t *vCex;
  long lVar1;
  int iVar2;
  int iObj;
  abctime aVar3;
  Cbs2_Man_t *p;
  Vec_Str_t *p_00;
  char *pcVar4;
  Vec_Int_t *vCexStore;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  abctime aVar5;
  abctime aVar6;
  int iVar7;
  bool bVar8;
  
  aVar3 = Abc_Clock();
  if (pAig->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x621,"Vec_Int_t *Cbs2_ManSolveMiterNc(Gia_Man_t *, int, Vec_Str_t **, int)");
  }
  Gia_ManCreateRefs(pAig);
  p = Cbs2_ManAlloc(pAig);
  (p->Pars).nBTLimit = nConfs;
  iVar7 = pAig->vCos->nSize - pAig->nRegs;
  p_00 = (Vec_Str_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar2 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar2;
  iVar7 = 0;
  if (iVar2 == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = (char *)malloc((long)iVar2);
  }
  p_00->pArray = pcVar4;
  vCexStore = Vec_IntAlloc(10000);
  p_01 = Vec_IntAlloc(100);
  vCex = p->vModel;
  for (; iVar7 < pAig->vCos->nSize; iVar7 = iVar7 + 1) {
    iVar2 = Vec_IntEntry(pAig->vCos,iVar7);
    pObj = Gia_ManObj(pAig,iVar2);
    if (pObj == (Gia_Obj_t *)0x0) break;
    vCex->nSize = 0;
    if ((~*(ulong *)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff)) & 0x1fffffff1fffffff)
        == 0) {
      bVar8 = ((uint)*(undefined8 *)pObj >> 0x1d & 1) != 0;
      if (bVar8) {
        Cec_ManSatAddToStore(vCexStore,vCex,iVar7);
      }
      Vec_StrPush(p_00,!bVar8);
    }
    else {
      aVar5 = Abc_Clock();
      (p->Pars).fUseHighest = 1;
      (p->Pars).fUseLowest = 0;
      Gia_ManIncrementTravId(pAig);
      iVar2 = Gia_ObjFaninId0p(pAig,pObj);
      Cbs2_ManCreateFanout_rec(p,iVar2);
      iVar2 = Gia_ObjFaninId0p(pAig,pObj);
      iVar2 = Abc_Var2Lit(iVar2,*(uint *)pObj >> 0x1d & 1);
      iVar2 = Cbs2_ManSolve(p,iVar2);
      iObj = Gia_ObjFaninId0p(pAig,pObj);
      Cbs2_ManDeleteFanout_rec(p,iObj);
      Vec_StrPush(p_00,(char)iVar2);
      if (iVar2 == 1) {
        p->nSatUnsat = p->nSatUnsat + 1;
        p->nConfUnsat = p->nConfUnsat + (p->Pars).nBTThis;
        aVar6 = Abc_Clock();
        p->timeSatUnsat = p->timeSatUnsat + (aVar6 - aVar5);
      }
      else if (iVar2 == -1) {
        p->nSatUndec = p->nSatUndec + 1;
        p->nConfUndec = p->nConfUndec + (p->Pars).nBTThis;
        Cec_ManSatAddToStore(vCexStore,(Vec_Int_t *)0x0,iVar7);
        aVar6 = Abc_Clock();
        p->timeSatUndec = p->timeSatUndec + (aVar6 - aVar5);
      }
      else {
        p->nSatSat = p->nSatSat + 1;
        p->nConfSat = p->nConfSat + (p->Pars).nBTThis;
        Cec_ManSatAddToStore(vCexStore,vCex,iVar7);
        aVar6 = Abc_Clock();
        p->timeSatSat = p->timeSatSat + (aVar6 - aVar5);
      }
    }
  }
  Vec_IntFree(p_01);
  p->nSatTotal = pAig->vCos->nSize - pAig->nRegs;
  aVar5 = Abc_Clock();
  p->timeTotal = aVar5 - aVar3;
  if (fVerbose != 0) {
    Cbs2_ManSatPrintStats(p);
  }
  iVar2 = 0x8258fa;
  printf("Prop1 = %d.  Prop2 = %d.  Prop3 = %d.  ClaConf = %d.   FailJ = %d.  FailC = %d.   ",
         (ulong)(uint)p->nPropCalls[0],(ulong)(uint)p->nPropCalls[1],(ulong)(uint)p->nPropCalls[2],
         (ulong)(uint)p->nClauseConf,(ulong)(uint)p->nFails[0],p->nFails[1]);
  lVar1 = p->timeJFront;
  Abc_Print(iVar2,"%s =","JFront");
  Abc_Print(iVar2,"%9.2f sec\n",(double)lVar1 / 1000000.0);
  Cbs2_ManStop(p);
  *pvStatus = p_00;
  return vCexStore;
}

Assistant:

Vec_Int_t * Cbs2_ManSolveMiterNc( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose )
{
    extern void Gia_ManCollectTest( Gia_Man_t * pAig );
    extern void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out );
    Cbs2_Man_t * p; 
    Vec_Int_t * vCex, * vVisit, * vCexStore;
    Vec_Str_t * vStatus;
    Gia_Obj_t * pRoot; 
    int i, status;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) == 0 );
//    Gia_ManCollectTest( pAig );
    // prepare AIG
    Gia_ManCreateRefs( pAig );
    //Gia_ManLevelNum( pAig );
    //Gia_ManCleanMark0( pAig );
    //Gia_ManCleanMark1( pAig );
    //Gia_ManFillValue( pAig ); // maps nodes into trail ids
    //Gia_ManSetPhase( pAig ); // maps nodes into trail ids
    // create logic network
    p = Cbs2_ManAlloc( pAig );
    p->Pars.nBTLimit = nConfs;
    // create resulting data-structures
    vStatus   = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    vVisit    = Vec_IntAlloc( 100 );
    vCex      = Cbs2_ReadModel( p );
    // solve for each output
    Gia_ManForEachCo( pAig, pRoot, i )
    {
        //printf( "\nOutput %d\n", i );

        Vec_IntClear( vCex );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) )
        {
            if ( Gia_ObjFaninC0(pRoot) )
            {
//                printf( "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                printf( "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        clk = Abc_Clock();
        p->Pars.fUseHighest = 1;
        p->Pars.fUseLowest  = 0;

        Gia_ManIncrementTravId( pAig );
        Cbs2_ManCreateFanout_rec( p, Gia_ObjFaninId0p(pAig, pRoot) );
        //Cbs2_ManPrintFanouts( p );

        status = Cbs2_ManSolve( p, Gia_ObjFaninLit0p(pAig, pRoot) );
        //printf( "\n" );

        Cbs2_ManDeleteFanout_rec( p, Gia_ObjFaninId0p(pAig, pRoot) );
        //Cbs2_ManCheckFanouts( p );

/*
        if ( status == -1 )
        {
            p->Pars.fUseHighest = 0;
            p->Pars.fUseLowest  = 1;
            status = Cbs2_ManSolve( p, Gia_ObjChild0(pRoot) );
        }
*/
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
            p->nSatUndec++;
            p->nConfUndec += p->Pars.nBTThis;
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            p->timeSatUndec += Abc_Clock() - clk;
            continue;
        }
        if ( status == 1 )
        {
            p->nSatUnsat++;
            p->nConfUnsat += p->Pars.nBTThis;
            p->timeSatUnsat += Abc_Clock() - clk;
            continue;
        }
        p->nSatSat++;
        p->nConfSat += p->Pars.nBTThis;
//        Gia_SatVerifyPattern( pAig, pRoot, vCex, vVisit );
        Cec_ManSatAddToStore( vCexStore, vCex, i );
        p->timeSatSat += Abc_Clock() - clk;
    }
    Vec_IntFree( vVisit );
    p->nSatTotal = Gia_ManPoNum(pAig);
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Cbs2_ManSatPrintStats( p );
//    printf( "RecCalls = %8d.  RecClause = %8d.  RecNonChro = %8d.\n", p->nRecCall, p->nRecClause, p->nRecNonChro );
    printf( "Prop1 = %d.  Prop2 = %d.  Prop3 = %d.  ClaConf = %d.   FailJ = %d.  FailC = %d.   ", p->nPropCalls[0], p->nPropCalls[1], p->nPropCalls[2], p->nClauseConf, p->nFails[0], p->nFails[1] );
    Abc_PrintTime( 1, "JFront", p->timeJFront );

    Cbs2_ManStop( p );
    *pvStatus = vStatus;

//    printf( "Total number of cex literals = %d. (Ave = %d)\n", 
//         Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat, 
//        (Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat)/p->nSatSat );
    return vCexStore;
}